

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  float fVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  ulong uVar4;
  uint uVar5;
  nk_rect bounds;
  nk_rect local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  uint uVar6;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4aaf,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    uVar5 = 0;
    uVar6 = 0;
    if (ctx->active == pnVar2) {
      pnVar3 = pnVar2->layout;
      local_58 = ZEXT416((uint)(pnVar3->clip).y);
      local_68 = ZEXT416((uint)(pnVar3->clip).h);
      local_48 = ZEXT416((uint)(float)(int)(pnVar3->clip).x);
      local_38 = ZEXT416((uint)(float)(int)(pnVar3->clip).w);
      nk_layout_peek(&local_78,ctx);
      if ((local_78.x <= (float)local_38._0_4_ + (float)local_48._0_4_) &&
         ((float)local_48._0_4_ <= local_78.x + local_78.w)) {
        uVar5 = uVar6;
        if ((local_78.y <= (float)(int)(float)local_68._0_4_ + (float)(int)(float)local_58._0_4_) &&
           ((float)(int)(float)local_58._0_4_ <= local_78.y + local_78.h)) {
          uVar4 = (ulong)btn;
          fVar1 = *(float *)((long)(ctx->style).cursors + uVar4 * 0x10 + -100);
          if ((((local_78.x <= fVar1) && (fVar1 < local_78.x + local_78.w)) &&
              (fVar1 = *(float *)((ctx->style).cursors + uVar4 * 2 + -0xc), local_78.y <= fVar1)) &&
             (fVar1 < local_78.y + local_78.h)) {
            uVar5 = (uint)((ctx->input).mouse.buttons[uVar4].down == down);
          }
        }
      }
    }
    return uVar5;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4ab0,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
}